

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgraphel1d.cpp
# Opt level: O1

int __thiscall TPZGraphEl1d::NPoints(TPZGraphEl1d *this,TPZGraphNode *n)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = TPZGraphEl::ConnectNum(&this->super_TPZGraphEl,n);
  uVar2 = 1;
  if (1 < uVar1) {
    if (uVar1 == 2) {
      uVar2 = ~(-1 << ((byte)((this->super_TPZGraphEl).fGraphMesh)->fResolution & 0x1f));
    }
    else {
      uVar2 = 0;
    }
  }
  return uVar2;
}

Assistant:

int TPZGraphEl1d::NPoints(TPZGraphNode *n)
{
	int in = ConnectNum(n);
	int res = fGraphMesh->Res();
	switch(in)
	{
		case 0:
		case 1:
			return(1);
		case 2:
			return((1 << res)-1);
	};
	return(0);
}